

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveJacobi
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL *tol,int FromCurrent)

{
  long lVar1;
  complex<long_double> *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar11;
  undefined1 local_b8 [80];
  complex<long_double> local_68;
  
  if (FromCurrent == 0) {
    TPZFMatrix<std::complex<long_double>_>::operator=(scratch,F);
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  else {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
  }
  Dot<std::complex<long_double>>(&local_68,scratch,scratch);
  lVar11 = in_ST6;
  sqrtl();
  iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  if (0 < *numiterations) {
    lVar1 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    lVar5 = 0;
    local_b8._0_10_ = in_ST0;
    do {
      if (ABS((double)in_ST0) < *tol || ABS((double)in_ST0) == *tol) break;
      if (0 < lVar1) {
        lVar7 = 0;
        local_b8._0_10_ = (unkuint10)(ushort)local_b8._8_2_ << 0x40;
        do {
          if (0 < CONCAT44(extraout_var,iVar3)) {
            lVar6 = 0x10;
            lVar8 = 0;
            lVar9 = in_ST1;
            lVar10 = in_ST2;
            do {
              in_ST2 = in_ST4;
              in_ST1 = in_ST3;
              if (((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                   <= lVar8) ||
                 ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
                  (long)local_b8._0_8_)) {
                TPZFMatrix<std::complex<long_double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_68,this,lVar8,lVar8);
              in_ST3 = in_ST2;
              in_ST4 = in_ST2;
              __divxc3();
              if (((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow <=
                   lVar8) ||
                 ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <=
                  (long)local_b8._0_8_)) {
                TPZFMatrix<std::complex<long_double>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar4 = (result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow
                      * lVar7;
              pcVar2 = result->fElem;
              *(longdouble *)(pcVar2->_M_value + lVar6 + -0x10 + lVar4) =
                   lVar9 + *(longdouble *)(pcVar2->_M_value + lVar6 + -0x10 + lVar4);
              *(longdouble *)(pcVar2->_M_value + lVar6 + lVar4) =
                   lVar10 + *(longdouble *)(pcVar2->_M_value + lVar6 + lVar4);
              lVar8 = lVar8 + 1;
              lVar6 = lVar6 + 0x20;
              lVar9 = in_ST1;
              lVar10 = in_ST2;
              in_ST5 = in_ST4;
              in_ST6 = in_ST4;
              lVar11 = in_ST4;
            } while (CONCAT44(extraout_var,iVar3) != lVar8);
          }
          lVar6 = local_b8._0_8_ + 1;
          lVar7 = lVar7 + 0x20;
          local_b8._0_8_ = lVar6;
        } while (lVar6 != lVar1);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F,scratch);
      Dot<std::complex<long_double>>(&local_68,scratch,scratch);
      lVar9 = lVar11;
      sqrtl();
      lVar5 = lVar5 + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar11;
      lVar11 = lVar9;
    } while (lVar5 < *numiterations);
  }
  if (residual != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    TPZFMatrix<std::complex<long_double>_>::operator=(residual,scratch);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveJacobi(int64_t &numiterations,const TPZFMatrix<TVar> &F, TPZFMatrix<TVar> &result,
								  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch, REAL &tol,const int FromCurrent) {
	
	
	if(FromCurrent) {
		Residual(result,F,scratch);
	} else {
		scratch = F;
		result.Zero();
	}
	REAL res;
	res = TPZExtractVal::val(Norm(scratch));
	int64_t r = Dim();
	int64_t c = F.Cols();
	for(int64_t it=0; it<numiterations && (fabs(res)) > tol; it++) {
		for(int64_t ic=0; ic<c; ic++) {
			for(int64_t i=0; i<r; i++) {
				result(i,ic) += (scratch)(i,ic)/GetVal(i,i);
			}
		}
		Residual(result,F,scratch);
		res = TPZExtractVal::val(Norm(scratch));
	}
	if(residual) *residual = scratch;
}